

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::
HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>_>
::disposeImpl(HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>_>
              *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>_>
  *this_local;
  
  if (pointer != (void *)0x0) {
    AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>::
    ~AdapterPromiseNode((AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>
                         *)pointer);
    operator_delete(pointer,0x1c8);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }